

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGenericDiagonalMass.cpp
# Opt level: O2

ChVariablesGenericDiagonalMass * __thiscall
chrono::ChVariablesGenericDiagonalMass::operator=
          (ChVariablesGenericDiagonalMass *this,ChVariablesGenericDiagonalMass *other)

{
  if (other != this) {
    ChVariables::operator=(&this->super_ChVariables,&other->super_ChVariables);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->MmassDiag,&other->MmassDiag);
  }
  return this;
}

Assistant:

ChVariablesGenericDiagonalMass& ChVariablesGenericDiagonalMass::operator=(const ChVariablesGenericDiagonalMass& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariables::operator=(other);

    MmassDiag = other.MmassDiag;

    return *this;
}